

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O1

int X509_digest(X509 *data,EVP_MD *type,uchar *md,uint *len)

{
  uint uVar1;
  int iVar2;
  uint8_t *der;
  uint8_t *local_20;
  
  local_20 = (uint8_t *)0x0;
  uVar1 = i2d_X509((X509 *)data,&local_20);
  if ((int)uVar1 < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = EVP_Digest(local_20,(ulong)uVar1,md,len,type,(ENGINE *)0x0);
    OPENSSL_free(local_20);
  }
  return iVar2;
}

Assistant:

int X509_digest(const X509 *x509, const EVP_MD *md, uint8_t *out,
                unsigned *out_len) {
  uint8_t *der = NULL;
  // TODO(https://crbug.com/boringssl/407): This function is not const-correct.
  int der_len = i2d_X509((X509 *)x509, &der);
  if (der_len < 0) {
    return 0;
  }

  int ret = EVP_Digest(der, der_len, out, out_len, md, NULL);
  OPENSSL_free(der);
  return ret;
}